

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O3

bool Am_Delete_Selective_Undo_Allowed_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Value value;
  Am_Value local_28;
  Am_Value local_18;
  
  bVar1 = Am_Object::Valid(command_obj);
  if (bVar1) {
    local_28.type = 0;
    local_28.value.wrapper_value = (Am_Wrapper *)0x0;
    in_value = Am_Object::Get(command_obj,0x16d,5);
    Am_Value::operator=(&local_28,in_value);
    Am_Value::Am_Value(&local_18,&local_28);
    bVar1 = Am_Valid_and_Visible_List_Or_Object(&local_18,true);
    Am_Value::~Am_Value(&local_18);
    bVar1 = !bVar1;
    Am_Value::~Am_Value(&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

Am_Define_Method(Am_Selective_Allowed_Method, bool,
                 Am_Delete_Selective_Undo_Allowed, (Am_Object command_obj))
{
  if (!command_obj.Valid())
    return false;
  Am_Value value;
  value = command_obj.Peek(Am_OBJECT_MODIFIED, Am_NO_DEPENDENCY);
  bool ret = Am_Valid_and_Visible_List_Or_Object(value);
  //std::cout << "*** valid and vis returns " << ret << " for obj mod " << value
  //      << " in command " << command_obj <<std::endl <<std::flush;
  return !ret;
}